

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O3

_Bool is_event_equal_for_match(LIST_ITEM_HANDLE list_item,void *match_context)

{
  int iVar1;
  undefined8 *puVar2;
  char *__s1;
  _Bool _Var3;
  
  puVar2 = (undefined8 *)singlylinkedlist_item_get_value(list_item);
  if (puVar2 == (undefined8 *)0x0) {
    _Var3 = false;
  }
  else {
    __s1 = STRING_c_str((STRING_HANDLE)*puVar2);
    if (match_context == (void *)0x0 || __s1 == (char *)0x0) {
      _Var3 = match_context == (void *)0x0 && __s1 == (char *)0x0;
    }
    else {
      iVar1 = strcmp(__s1,(char *)match_context);
      _Var3 = iVar1 == 0;
    }
  }
  return _Var3;
}

Assistant:

static bool is_event_equal_for_match(LIST_ITEM_HANDLE list_item, const void* match_context)
{
    return is_event_equal((IOTHUB_EVENT_CALLBACK*)singlylinkedlist_item_get_value(list_item), (const char*)match_context);
}